

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void __thiscall
duckdb::UpdateSegment::FetchCommittedRange
          (UpdateSegment *this,idx_t start_row,idx_t count,Vector *result)

{
  fetch_committed_range_function_t p_Var1;
  _func_int ***ppp_Var2;
  idx_t iVar3;
  ulong uVar4;
  StorageLockKey *pSVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock_handle;
  UndoBufferPointer entry;
  UndoBufferReference pin;
  StorageLock local_90;
  StorageLockKey *local_80;
  idx_t local_78;
  Vector *local_70;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  if ((this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
      super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl != (UpdateNode *)0x0) {
    uVar8 = start_row >> 0xb;
    uVar4 = (count + start_row) - 1;
    uVar6 = uVar4 >> 0xb;
    pSVar5 = (StorageLockKey *)&this->lock;
    local_70 = result;
    StorageLock::GetSharedLock(&local_90);
    local_90.internals.internal.
    super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar6 - uVar8);
    if (uVar8 <= uVar6) {
      local_80 = (StorageLockKey *)(ulong)((uint)start_row & 0x7ff);
      local_78 = (count + start_row) - (uVar4 & 0xfffffffffffff800);
      ppp_Var2 = &(local_90.internals.internal.
                   super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base;
      lVar7 = uVar8 * 0x800 - start_row;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
        operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                   *)&local_90);
        local_68 = GetUpdateNode(this,pSVar5,(idx_t)((long)&p_Var9->_vptr__Sp_counted_base + uVar8))
        ;
        if (local_68.entry != (UndoBufferEntry *)0x0) {
          UndoBufferPointer::Pin(&local_58,&local_68);
          p_Var1 = this->fetch_committed_range;
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
          pSVar5 = (StorageLockKey *)0x0;
          if (p_Var9 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pSVar5 = local_80;
          }
          iVar3 = 0x800;
          if (local_90.internals.internal.
              super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == p_Var9) {
            iVar3 = local_78;
          }
          (*p_Var1)((UpdateInfo *)((local_58.handle.node.ptr)->buffer + local_58.position),
                    (idx_t)pSVar5,iVar3,
                    (long)&(pSVar5->internals).internal.
                           super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar7,local_70);
          BufferHandle::~BufferHandle(&local_58.handle);
        }
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var9->_vptr__Sp_counted_base + 1);
        lVar7 = lVar7 + 0x800;
      } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)ppp_Var2 + 1) != p_Var9);
    }
    if (local_90.internals.internal.
        super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      StorageLockKey::~StorageLockKey
                ((StorageLockKey *)
                 local_90.internals.internal.
                 super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      operator_delete(local_90.internals.internal.
                      super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
  }
  return;
}

Assistant:

void UpdateSegment::FetchCommittedRange(idx_t start_row, idx_t count, Vector &result) {
	D_ASSERT(count > 0);
	if (!root) {
		return;
	}
	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);

	idx_t end_row = start_row + count;
	idx_t start_vector = start_row / STANDARD_VECTOR_SIZE;
	idx_t end_vector = (end_row - 1) / STANDARD_VECTOR_SIZE;
	D_ASSERT(start_vector <= end_vector);

	auto lock_handle = lock.GetSharedLock();
	for (idx_t vector_idx = start_vector; vector_idx <= end_vector; vector_idx++) {
		auto entry = GetUpdateNode(*lock_handle, vector_idx);
		if (!entry.IsSet()) {
			continue;
		}
		auto pin = entry.Pin();
		idx_t start_in_vector = vector_idx == start_vector ? start_row - start_vector * STANDARD_VECTOR_SIZE : 0;
		idx_t end_in_vector =
		    vector_idx == end_vector ? end_row - end_vector * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		D_ASSERT(start_in_vector < end_in_vector);
		D_ASSERT(end_in_vector > 0 && end_in_vector <= STANDARD_VECTOR_SIZE);
		idx_t result_offset = ((vector_idx * STANDARD_VECTOR_SIZE) + start_in_vector) - start_row;
		fetch_committed_range(UpdateInfo::Get(pin), start_in_vector, end_in_vector, result_offset, result);
	}
}